

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clienttest.cpp
# Opt level: O2

void MyErrorMsgHandler(int iLevel,char *szMsg)

{
  undefined *puVar1;
  
  if (iLevel - 1U < 4) {
    puVar1 = &DAT_001081d4 + *(int *)(&DAT_001081d4 + (ulong)(iLevel - 1U) * 4);
  }
  else {
    puVar1 = (undefined *)0x0;
  }
  printf("  %s: %s\n",puVar1,szMsg);
  return;
}

Assistant:

void MyErrorMsgHandler(int iLevel, const char *szMsg)
{
  const char *szLevel = NULL;

  if (iLevel == VL_Debug) {
    szLevel = "Debug";
  } else if (iLevel == VL_Info) {
    szLevel = "Info";
  } else if (iLevel == VL_Warning) {
    szLevel = "Warning";
  } else if (iLevel == VL_Error) {
    szLevel = "Error";
  }
  printf("  %s: %s\n", szLevel, szMsg);
}